

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O2

uchar __thiscall bidfx_public_api::tools::ByteBuffer::ReadByte(ByteBuffer *this)

{
  uchar uVar1;
  ostream *poVar2;
  out_of_range *this_00;
  string local_1c0 [32];
  stringstream ss;
  ostream local_190 [376];
  
  if (this->reader_index_ != this->writer_index_) {
    uVar1 = GetNextByte(this);
    return uVar1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_190,"Readable byte limit exceeded: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::out_of_range::out_of_range(this_00,local_1c0);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

unsigned char ByteBuffer::ReadByte()
{
    if (reader_index_ == writer_index_)
    {
        std::stringstream ss;
        ss << "Readable byte limit exceeded: " << reader_index_;
        throw std::out_of_range(ss.str());
    }
    return GetNextByte();
}